

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O0

void __thiscall
adios2::transport::FilePOSIX::Write(FilePOSIX *this,char *buffer,size_t size,size_t start)

{
  int *piVar1;
  __off_t _Var2;
  ulong uVar3;
  long in_RCX;
  ulong in_RDX;
  long in_RDI;
  size_t b;
  size_t position;
  size_t remainder;
  size_t batches;
  __off_t pos;
  __off_t newPosition;
  anon_class_8_1_8991fb9c lf_Write;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  int commRank;
  string *in_stack_fffffffffffffe68;
  FilePOSIX *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  string local_178 [32];
  FilePOSIX *in_stack_fffffffffffffea8;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [39];
  undefined1 local_b1 [40];
  undefined1 local_89 [56];
  allocator local_51;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffc0;
  
  commRank = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  WaitForOpen(in_stack_fffffffffffffe70);
  if (in_RCX == -1) {
    lseek(*(int *)(in_RDI + 0xf0),0,1);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    _Var2 = lseek(*(int *)(in_RDI + 0xf0),in_RCX,0);
    piVar1 = __errno_location();
    *(int *)(in_RDI + 0xf4) = *piVar1;
    if (_Var2 != in_RCX) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,"Toolkit",&local_51);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_89 + 1),"transport::file::FilePOSIX",(allocator *)__lhs);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_b1 + 1),"Write",(allocator *)__rhs);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe58);
      std::operator+((char *)__lhs,__rhs);
      std::operator+(__lhs,(char *)__rhs);
      std::operator+(__lhs,__rhs);
      std::operator+(__lhs,(char *)__rhs);
      SysErrMsg_abi_cxx11_(in_stack_fffffffffffffea8);
      std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (string *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,commRank);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string((string *)(local_b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_b1);
      std::__cxx11::string::~string((string *)(local_89 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_89);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
  }
  if (in_RDX < 0x7ffe7001) {
    Write::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  else {
    uVar3 = in_RDX / 0x7ffe7000;
    for (local_1c0 = 0; local_1c0 < uVar3; local_1c0 = local_1c0 + 1) {
      Write::anon_class_8_1_8991fb9c::operator()
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
    Write::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void FilePOSIX::Write(const char *buffer, size_t size, size_t start)
{
    auto lf_Write = [&](const char *buffer, size_t size) {
        while (size > 0)
        {
            ProfilerStart("write");
            ProfilerWriteBytes(size);
            errno = 0;
            const auto writtenSize = write(m_FileDescriptor, buffer, size);
            m_Errno = errno;
            ProfilerStop("write");

            if (writtenSize == -1)
            {
                if (errno == EINTR)
                {
                    continue;
                }

                helper::Throw<std::ios_base::failure>(
                    "Toolkit", "transport::file::FilePOSIX", "Write",
                    "couldn't write to file " + m_Name + " " + SysErrMsg());
            }

            buffer += writtenSize;
            size -= writtenSize;
        }
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        errno = 0;
        const auto newPosition = lseek(m_FileDescriptor, start, SEEK_SET);
        m_Errno = errno;

        if (static_cast<size_t>(newPosition) != start)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FilePOSIX", "Write",
                                                  "couldn't move to start position " +
                                                      std::to_string(start) + " in file " + m_Name +
                                                      " " + SysErrMsg());
        }
    }
    else
    {
        const auto pos = lseek(m_FileDescriptor, 0, SEEK_CUR);
        start = static_cast<size_t>(pos);
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Write(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Write(&buffer[position], remainder);
    }
    else
    {
        lf_Write(buffer, size);
    }
}